

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

string * __thiscall
Json::GetParseJsonErrorStr_abi_cxx11_(string *__return_storage_ptr__,Json *this,int errorCode)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(errorCode) {
  case 1:
    pcVar2 = "The document is empty.";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "The document root must not follow by other values.";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Invalid value.";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Missing a name for object member.";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Missing a colon after a name of object member.";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Missing a comma or \'}\' after an object member.";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Missing a comma or \']\' after an array element.";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "Incorrect hex digit after \\\\u escape in string.";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "The surrogate pair in string is invalid.";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "Invalid escape character in string.";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "Missing a closing quotation mark in string.";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Invalid encoding in string.";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "Number too big to be stored in double.";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "Miss fraction part in number.";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "Miss exponent in number.";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "Parsing was terminated.";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "Unspecific syntax error.";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string GetParseJsonErrorStr(int errorCode)
    {
        switch (errorCode)
        {
            case kParseErrorDocumentEmpty:
                return "The document is empty.";
            case kParseErrorDocumentRootNotSingular:
                return "The document root must not follow by other values.";
            case kParseErrorValueInvalid:
                return "Invalid value.";
            case kParseErrorObjectMissName:
                return "Missing a name for object member.";
            case kParseErrorObjectMissColon:
                return "Missing a colon after a name of object member.";
            case kParseErrorObjectMissCommaOrCurlyBracket:
                return "Missing a comma or '}' after an object member.";
            case kParseErrorArrayMissCommaOrSquareBracket:
                return "Missing a comma or ']' after an array element.";
            case kParseErrorStringUnicodeEscapeInvalidHex:
                return "Incorrect hex digit after \\\\u escape in string.";
            case kParseErrorStringUnicodeSurrogateInvalid:
                return "The surrogate pair in string is invalid.";
            case kParseErrorStringEscapeInvalid:
                return "Invalid escape character in string.";
            case kParseErrorStringMissQuotationMark:
                return "Missing a closing quotation mark in string.";
            case kParseErrorStringInvalidEncoding:
                return "Invalid encoding in string.";
            case kParseErrorNumberTooBig:
                return "Number too big to be stored in double.";
            case kParseErrorNumberMissFraction:
                return "Miss fraction part in number.";
            case kParseErrorNumberMissExponent:
                return "Miss exponent in number.";
            case kParseErrorTermination:
                return "Parsing was terminated.";
            case kParseErrorUnspecificSyntaxError:
                return "Unspecific syntax error.";
            default:
                return "Unknown";
        }
    }